

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O2

Matrix * __thiscall lunasvg::Element::getGlobalMatrix(Matrix *__return_storage_ptr__,Element *this)

{
  SVGElement *pSVar1;
  Transform transform;
  Transform local_38;
  
  if ((this->super_Node).m_node == (SVGNode *)0x0) {
    __return_storage_ptr__->a = 1.0;
    __return_storage_ptr__->b = 0.0;
    __return_storage_ptr__->c = 0.0;
    __return_storage_ptr__->d = 1.0;
    __return_storage_ptr__->e = 0.0;
    __return_storage_ptr__->f = 0.0;
  }
  else {
    pSVar1 = element(this,true);
    (*(pSVar1->super_SVGNode)._vptr_SVGNode[10])(&transform,pSVar1);
    pSVar1 = (SVGElement *)(this->super_Node).m_node;
    while (pSVar1 = (pSVar1->super_SVGNode).m_parentElement, pSVar1 != (SVGElement *)0x0) {
      (*(pSVar1->super_SVGNode)._vptr_SVGNode[10])(&local_38,pSVar1);
      Transform::postMultiply(&transform,&local_38);
    }
    __return_storage_ptr__->a = transform.m_matrix.a;
    __return_storage_ptr__->b = transform.m_matrix.b;
    __return_storage_ptr__->c = transform.m_matrix.c;
    __return_storage_ptr__->d = transform.m_matrix.d;
    __return_storage_ptr__->e = transform.m_matrix.e;
    __return_storage_ptr__->f = transform.m_matrix.f;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Element::getGlobalMatrix() const
{
    if(m_node == nullptr)
        return Matrix();
    auto transform = element(true)->localTransform();
    for(auto parent = element()->parentElement(); parent; parent = parent->parentElement())
        transform.postMultiply(parent->localTransform());
    return transform;
}